

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDLImporter::MDLImporter(MDLImporter *this)

{
  MDLImporter *this_local;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0104c900;
  this->configFrameID = 0;
  std::__cxx11::string::string((string *)&this->configPalette);
  this->mBuffer = (uchar *)0x0;
  this->iGSFileVersion = 0;
  this->pIOHandler = (IOSystem *)0x0;
  this->pScene = (aiScene *)0x0;
  this->iFileSize = 0;
  return;
}

Assistant:

MDLImporter::MDLImporter()
: configFrameID()
, mBuffer()
, iGSFileVersion()
, pIOHandler()
, pScene()
, iFileSize() {
    // empty
}